

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DenavitHartenberg.cpp
# Opt level: O0

bool iDynTree::closestPoints
               (Axis *line_A,Axis *line_B,Position *closest_point_line_A,
               Position *closest_point_line_B,double tol)

{
  ReturnType RVar1;
  ReturnType RVar2;
  ReturnType RVar3;
  bool bVar4;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_RDI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  double t_C;
  double s_C;
  double denominator;
  double e;
  double d;
  double c;
  double b;
  double a;
  Vector3d w0;
  Vector3d direction_line_B;
  Vector3d direction_line_A;
  Vector3d origin_line_B;
  Vector3d origin_line_A;
  DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
  *in_stack_fffffffffffffdc8;
  VectorFixSize<3U> *in_stack_fffffffffffffde8;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *in_stack_fffffffffffffdf0;
  MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *in_stack_fffffffffffffdf8;
  StorageBaseType *in_stack_fffffffffffffe10;
  double *in_stack_fffffffffffffe18;
  
  iDynTree::Axis::getOrigin();
  toEigen<3U>(in_stack_fffffffffffffde8);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_RDI,
             (EigenBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)in_stack_fffffffffffffdc8);
  iDynTree::Axis::getOrigin();
  toEigen<3U>(in_stack_fffffffffffffde8);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_RDI,
             (EigenBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)in_stack_fffffffffffffdc8);
  iDynTree::Axis::getDirection();
  toEigen<3U>(in_stack_fffffffffffffde8);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_RDI,
             (EigenBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)in_stack_fffffffffffffdc8);
  iDynTree::Axis::getDirection();
  toEigen<3U>(in_stack_fffffffffffffde8);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>const,0,Eigen::Stride<0,0>>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_RDI,
             (EigenBase<Eigen::Map<const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_>_>
              *)in_stack_fffffffffffffdc8);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator-
            (in_stack_fffffffffffffdf8,
             (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffdf0);
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Matrix<double,_3,_1,_0,_3,_1> *)in_RDI,
             (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)in_stack_fffffffffffffdc8);
  RVar1 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::dot<Eigen::Matrix<double,3,1,0,3,1>>
                    (in_RDI,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                            in_stack_fffffffffffffdc8);
  RVar2 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::dot<Eigen::Matrix<double,3,1,0,3,1>>
                    (in_RDI,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                            in_stack_fffffffffffffdc8);
  RVar3 = Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::dot<Eigen::Matrix<double,3,1,0,3,1>>
                    (in_RDI,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                            in_stack_fffffffffffffdc8);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::dot<Eigen::Matrix<double,3,1,0,3,1>>
            (in_RDI,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffdc8);
  Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::dot<Eigen::Matrix<double,3,1,0,3,1>>
            (in_RDI,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)in_stack_fffffffffffffdc8);
  bVar4 = (double)CONCAT44(in_XMM0_Db,in_XMM0_Da) <= ABS(RVar1 * RVar3 + -(RVar2 * RVar2));
  if (bVar4) {
    Eigen::operator*(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+
              (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
    toEigen<3U>(in_stack_fffffffffffffde8);
    Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>::operator=
              ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)in_RDI,
               in_stack_fffffffffffffdc8);
    Eigen::operator*(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+
              (in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
    toEigen<3U>(in_stack_fffffffffffffde8);
    Eigen::Map<Eigen::Matrix<double,3,1,0,3,1>,0,Eigen::Stride<0,0>>::operator=
              ((Map<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0,_Eigen::Stride<0,_0>_> *)in_RDI,
               in_stack_fffffffffffffdc8);
  }
  return bVar4;
}

Assistant:

bool closestPoints(const iDynTree::Axis line_A,
                   const iDynTree::Axis line_B,
                         iDynTree::Position & closest_point_line_A,
                         iDynTree::Position & closest_point_line_B,
                         double tol = 1e-6
                  )
{
    /*
      Using the notation in : http://geomalgorithms.com/a07-_distance.html
      direction_line_A is u
      origin_line_A is P_0
      direction_line_B is v
      origin_line_b is Q_0
      closest_point_line_A is P_C
      closest_point_line_B is Q_C
    */


    Eigen::Vector3d origin_line_A = toEigen(line_A.getOrigin());
    Eigen::Vector3d origin_line_B = toEigen(line_B.getOrigin());
    Eigen::Vector3d direction_line_A = toEigen(line_A.getDirection());
    Eigen::Vector3d direction_line_B = toEigen(line_B.getDirection());

    Eigen::Vector3d w0 = origin_line_A-origin_line_B;
    double a = direction_line_A.dot(direction_line_A);
    double b = direction_line_A.dot(direction_line_B);
    double c = direction_line_B.dot(direction_line_B);
    double d = direction_line_A.dot(w0);
    double e = direction_line_B.dot(w0);

    double denominator = a*c-b*b;

    // test with fabs because sometimes the numerical zero is computed as -epsilon
    if( fabs(denominator) < tol )
    {
        return false;
    }

    //Denominator should be nonnegative
    assert(denominator >= 0.0);

    double s_C = (b*e-c*d)/denominator;
    double t_C = (a*e-b*d)/denominator;

    toEigen(closest_point_line_A) = origin_line_A + s_C*direction_line_A;
    toEigen(closest_point_line_B) = origin_line_B + t_C*direction_line_B;

    return true;
}